

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

void ON_FileSystemPath::SplitPath
               (wchar_t *path,ON_wString *drive,ON_wString *dir,ON_wString *file_name_stem,
               ON_wString *ext)

{
  ON_wString local_90;
  int local_84;
  int length_2;
  int local_74;
  int length_1;
  int local_68;
  int length;
  ON_wString local_58;
  ON_wString local_path;
  wchar_t *e;
  wchar_t *f;
  wchar_t *d;
  wchar_t *dr;
  ON_wString *ext_local;
  ON_wString *file_name_stem_local;
  ON_wString *dir_local;
  ON_wString *drive_local;
  wchar_t *path_local;
  
  d = (wchar_t *)0x0;
  f = (wchar_t *)0x0;
  e = (wchar_t *)0x0;
  local_path.m_s = (wchar_t *)0x0;
  dr = (wchar_t *)ext;
  ext_local = file_name_stem;
  file_name_stem_local = dir;
  dir_local = drive;
  drive_local = (ON_wString *)path;
  ON_wString::ON_wString(&local_58,path);
  drive_local = (ON_wString *)ON_wString::operator_cast_to_wchar_t_(&local_58);
  on_wsplitpath((wchar_t *)drive_local,&d,&f,&e,&local_path.m_s);
  if (dir_local != (ON_wString *)0x0) {
    if (d == (wchar_t *)0x0) {
      ON_wString::Empty(dir_local);
    }
    else {
      if (f == (wchar_t *)0x0) {
        if (e == (wchar_t *)0x0) {
          if (local_path.m_s == (wchar_t *)0x0) {
            local_68 = ON_wString::Length(d);
          }
          else {
            local_68 = (int)((long)local_path.m_s - (long)d >> 2);
          }
        }
        else {
          local_68 = (int)((long)e - (long)d >> 2);
        }
      }
      else {
        local_68 = (int)((long)f - (long)d >> 2);
      }
      ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff90,d,local_68);
      ON_wString::operator=(dir_local,(ON_wString *)&stack0xffffffffffffff90);
      ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff90);
    }
  }
  if (file_name_stem_local != (ON_wString *)0x0) {
    if (f == (wchar_t *)0x0) {
      ON_wString::Empty(file_name_stem_local);
    }
    else {
      if (e == (wchar_t *)0x0) {
        if (local_path.m_s == (wchar_t *)0x0) {
          local_74 = ON_wString::Length(f);
        }
        else {
          local_74 = (int)((long)local_path.m_s - (long)f >> 2);
        }
      }
      else {
        local_74 = (int)((long)e - (long)f >> 2);
      }
      ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff80,f,local_74);
      ON_wString::operator=(file_name_stem_local,(ON_wString *)&stack0xffffffffffffff80);
      ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff80);
    }
  }
  if (ext_local != (ON_wString *)0x0) {
    if (e == (wchar_t *)0x0) {
      ON_wString::Empty(ext_local);
    }
    else {
      if (local_path.m_s == (wchar_t *)0x0) {
        local_84 = ON_wString::Length(e);
      }
      else {
        local_84 = (int)((long)local_path.m_s - (long)e >> 2);
      }
      ON_wString::ON_wString(&local_90,e,local_84);
      ON_wString::operator=(ext_local,&local_90);
      ON_wString::~ON_wString(&local_90);
    }
  }
  if (dr != (wchar_t *)0x0) {
    ON_wString::operator=((ON_wString *)dr,local_path.m_s);
  }
  ON_wString::~ON_wString(&local_58);
  return;
}

Assistant:

void ON_FileSystemPath::SplitPath( 
  const wchar_t* path,
  ON_wString* drive,
  ON_wString* dir,
  ON_wString* file_name_stem,
  ON_wString* ext
  )
{
  const wchar_t* dr = 0;
  const wchar_t* d = 0;
  const wchar_t* f = 0;
  const wchar_t* e = 0;

  // Use local path in case drive, dir, file_name_stem or ext are being reused.
  const ON_wString local_path(path);
  path = static_cast<const wchar_t*>(local_path);
  on_wsplitpath(path,&dr,&d,&f,&e);

  if ( 0 != drive )
  {
    if ( 0 != dr )
    {
      int length;
      if ( 0 != d )
        length = (int)(d-dr);
      else if ( 0 != f )
        length = (int)(f-dr);
      else if ( 0 != e )
        length = (int)(e-dr);
      else
        length = ON_wString::Length(dr);

      *drive = ON_wString(dr,length);
    }
    else
      drive->Empty();
  }

  if ( 0 != dir )
  {
    if ( 0 != d )
    {
      int length;
      if ( 0 != f )
        length = (int)(f-d);
      else if ( 0 != e )
        length = (int)(e-d);
      else
        length = ON_wString::Length(d);
      *dir = ON_wString(d,length);
    }
    else
      dir->Empty();
  }

  if ( 0 != file_name_stem )
  {
    if ( 0 != f )
    {
      int length;
      if ( 0 != e )
        length = (int)(e-f);
      else
        length = ON_wString::Length(f);
      *file_name_stem = ON_wString(f,length);
    }
    else
      file_name_stem->Empty();
  }

  if ( 0 != ext )
  {
    *ext = e;
  }
}